

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O2

void breakmsg(obj *obj,boolean in_view)

{
  char cVar1;
  ushort uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  cVar1 = obj->oclass;
  pcVar5 = "";
  if (cVar1 != '\b') {
    uVar2 = obj->otyp;
    if (3 < uVar2 - 0xea) {
      if (uVar2 - 0x218 < 2) {
        pcVar5 = "Splash!";
        goto LAB_0017f4d4;
      }
      if (uVar2 != 0x6b) {
        if ((uVar2 == 0x10f) || (uVar2 == 0x119)) {
          pcVar5 = "Splat!";
LAB_0017f4d4:
          pline(pcVar5);
          return;
        }
        if (uVar2 == 0x120) {
          if (in_view == '\0') {
            return;
          }
          pcVar5 = "What a mess!";
          goto LAB_0017f4d4;
        }
        if (uVar2 == 0x14f) goto LAB_0017f469;
        if ((cVar1 != '\x04') && (cVar1 != '\v')) {
          warning("breaking odd object?");
        }
      }
    }
    pcVar5 = " into a thousand pieces";
  }
LAB_0017f469:
  if (in_view != '\0') {
    pcVar3 = Doname2(obj);
    pcVar4 = "";
    if (obj->quan == 1) {
      pcVar4 = "s";
    }
    pline("%s shatter%s%s!",pcVar3,pcVar4,pcVar5);
    return;
  }
  You_hear("something shatter!");
  return;
}

Assistant:

static void breakmsg(struct obj *obj, boolean in_view)
{
	const char *to_pieces;

	to_pieces = "";
	switch (obj->oclass == POTION_CLASS ? POT_WATER : obj->otyp) {
		default: /* glass or crystal wand or ring */
		    if (obj->oclass != WAND_CLASS && obj->oclass != RING_CLASS)
			warning("breaking odd object?");
		case CRYSTAL_PLATE_MAIL:
		case LENSES:
		case MIRROR:
		case CRYSTAL_BALL:
		case EXPENSIVE_CAMERA:
			to_pieces = " into a thousand pieces";
			/*FALLTHRU*/
		case POT_WATER:		/* really, all potions */
			if (!in_view)
			    You_hear("something shatter!");
			else
			    pline("%s shatter%s%s!", Doname2(obj),
				(obj->quan==1) ? "s" : "", to_pieces);
			break;
		case EGG:
		case MELON:
			pline("Splat!");
			break;
		case CREAM_PIE:
			if (in_view) pline("What a mess!");
			break;
		case ACID_VENOM:
		case BLINDING_VENOM:
			pline("Splash!");
			break;
	}
}